

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_remove_child(isoent *parent,isoent *child)

{
  isoent *piVar1;
  isoent *local_20;
  isoent *ent;
  isoent *child_local;
  isoent *parent_local;
  
  for (local_20 = (parent->children).first; local_20->chnext != child; local_20 = local_20->chnext)
  {
  }
  piVar1 = local_20->chnext->chnext;
  local_20->chnext = piVar1;
  if (piVar1 == (isoent *)0x0) {
    (parent->children).last = &local_20->chnext;
  }
  (parent->children).cnt = (parent->children).cnt + -1;
  if ((char)(child->field_0xe8 << 6) < '\0') {
    for (local_20 = (parent->subdirs).first; local_20->drnext != child; local_20 = local_20->drnext)
    {
    }
    piVar1 = local_20->drnext->drnext;
    local_20->drnext = piVar1;
    if (piVar1 == (isoent *)0x0) {
      (parent->subdirs).last = &local_20->drnext;
    }
    (parent->subdirs).cnt = (parent->subdirs).cnt + -1;
  }
  __archive_rb_tree_remove_node(&parent->rbtree,&child->rbnode);
  return;
}

Assistant:

static void
isoent_remove_child(struct isoent *parent, struct isoent *child)
{
	struct isoent *ent;

	/* Remove a child entry from children chain. */
	ent = parent->children.first;
	while (ent->chnext != child)
		ent = ent->chnext;
	if ((ent->chnext = ent->chnext->chnext) == NULL)
		parent->children.last = &(ent->chnext);
	parent->children.cnt--;

	if (child->dir) {
		/* Remove a child entry from sub-directory chain. */
		ent = parent->subdirs.first;
		while (ent->drnext != child)
			ent = ent->drnext;
		if ((ent->drnext = ent->drnext->drnext) == NULL)
			parent->subdirs.last = &(ent->drnext);
		parent->subdirs.cnt--;
	}

	__archive_rb_tree_remove_node(&(parent->rbtree),
	    (struct archive_rb_node *)child);
}